

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O3

void __thiscall
jsoncons::typed_array_visitor<std::vector<float,_std::allocator<float>_>_>::visit_half_
          (typed_array_visitor<std::vector<float,_std::allocator<float>_>_> *this,uint param_2)

{
  vector<float,_std::allocator<float>_> *this_00;
  iterator __position;
  uint uVar1;
  uint uVar2;
  int __exponent;
  double dVar3;
  float local_14;
  
  this_00 = this->v_;
  uVar2 = param_2 >> 10 & 0x1f;
  uVar1 = param_2 & 0x3ff;
  if (uVar2 == 0x1f) {
    if (uVar1 == 0) {
      dVar3 = INFINITY;
    }
    else {
      dVar3 = nan("");
    }
  }
  else {
    if (uVar2 == 0) {
      __exponent = -0x18;
    }
    else {
      uVar1 = uVar1 | 0x400;
      __exponent = uVar2 - 0x19;
    }
    dVar3 = ldexp((double)uVar1,__exponent);
  }
  if ((short)param_2 < 0) {
    dVar3 = -dVar3;
  }
  __position._M_current =
       (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (this_00,__position,&local_14);
  }
  else {
    *__position._M_current = (float)dVar3;
    (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void visit_half_(std::false_type, uint16_t value)
        {
            v_.push_back(static_cast<value_type>(binary::decode_half(value)));
        }